

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingDistributions.cpp
# Opt level: O3

tuple<float,_float> getMoments(vector<float,_std::allocator<float>_> *results)

{
  float *pfVar1;
  iterator __end1;
  iterator __begin1;
  float *pfVar2;
  undefined8 *in_RSI;
  float *pfVar3;
  undefined8 in_XMM0_Qa;
  _Tuple_impl<0UL,_float,_float> _Var4;
  float fVar5;
  float fVar6;
  
  pfVar2 = (float *)*in_RSI;
  pfVar1 = (float *)in_RSI[1];
  if (pfVar2 == pfVar1) {
    _Var4.super__Head_base<0UL,_float,_false>._M_head_impl = (float)((ulong)in_XMM0_Qa >> 0x20);
    _Var4.super__Tuple_impl<1UL,_float>.super__Head_base<1UL,_float,_false>._M_head_impl =
         (_Head_base<1UL,_float,_false>)(float)(ulong)((long)pfVar1 - (long)pfVar2 >> 2);
    fVar6 = 0.0;
    fVar5 = 0.0 / (float)_Var4.super__Tuple_impl<1UL,_float>.super__Head_base<1UL,_float,_false>.
                         _M_head_impl;
  }
  else {
    fVar5 = 0.0;
    pfVar3 = pfVar2;
    do {
      fVar5 = fVar5 + *pfVar3;
      pfVar3 = pfVar3 + 1;
    } while (pfVar3 != pfVar1);
    _Var4.super__Tuple_impl<1UL,_float>.super__Head_base<1UL,_float,_false>._M_head_impl =
         (_Head_base<1UL,_float,_false>)(float)(ulong)((long)pfVar1 - (long)pfVar2 >> 2);
    _Var4.super__Head_base<0UL,_float,_false>._M_head_impl = 0.0;
    fVar5 = fVar5 / (float)_Var4.super__Tuple_impl<1UL,_float>.super__Head_base<1UL,_float,_false>.
                           _M_head_impl;
    fVar6 = 0.0;
    for (; pfVar1 != pfVar2; pfVar2 = pfVar2 + 1) {
      fVar6 = fVar6 + (*pfVar2 - fVar5) * (*pfVar2 - fVar5);
    }
  }
  *(float *)&(results->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start =
       fVar6 / (float)_Var4.super__Tuple_impl<1UL,_float>.super__Head_base<1UL,_float,_false>.
                      _M_head_impl.super__Head_base<1UL,_float,_false>;
  *(float *)((long)&(results->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start + 4) = fVar5;
  return (tuple<float,_float>)_Var4;
}

Assistant:

std::tuple<float, float> getMoments (std::vector <float> results){
	float sum = std::accumulate(results.begin(), results.end(), 0.0);
	float mean = sum / results.size();

	float sq_sum = 0.0;
	for (float x: results){
		sq_sum += (x-mean)*(x-mean);
	}
	float variance = sq_sum / results.size();

	return std::make_tuple(mean, variance);
}